

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O1

sysbvm_tuple_t sysbvm_type_decayReceiver(sysbvm_context_t *context,sysbvm_tuple_t type)

{
  _Bool _Var1;
  sysbvm_tuple_t tuple;
  
  _Var1 = sysbvm_tuple_isKindOf(context,type,(context->roots).referenceType);
  tuple = type;
  if (_Var1) {
    tuple = *(sysbvm_tuple_t *)(type + 0xf8);
    _Var1 = sysbvm_tuple_isKindOf(context,tuple,(context->roots).valueType);
    if (((_Var1) &&
        (_Var1 = sysbvm_tuple_isKindOf(context,tuple,(context->roots).primitiveValueType), !_Var1))
       && (_Var1 = sysbvm_tuple_isKindOf(context,tuple,(context->roots).pointerLikeType), _Var1)) {
      return type;
    }
  }
  return tuple;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_type_decayReceiver(sysbvm_context_t *context, sysbvm_tuple_t type)
{
    if(sysbvm_tuple_isKindOf(context, type, context->roots.referenceType))
    {
        sysbvm_tuple_t baseType = ((sysbvm_referenceType_t*)type)->super.baseType;
        if(sysbvm_tuple_isKindOf(context, baseType, context->roots.valueType) &&
            !sysbvm_tuple_isKindOf(context, baseType, context->roots.primitiveValueType) && !
            !sysbvm_tuple_isKindOf(context, baseType, context->roots.pointerLikeType))
            return type;
        return baseType;
    }

    return type;
}